

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O3

void __thiscall juzzlin::SimpleLogger::Impl::prefixWithTimestamp(Impl *this)

{
  uint uVar1;
  long lVar2;
  tm *__tp;
  size_t sVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar4;
  ostream *poVar5;
  ulong uVar6;
  uint __len;
  Impl *in_RSI;
  char *pcVar7;
  ostream *poVar8;
  ulong __val;
  bool bVar9;
  bool bVar10;
  string timestamp;
  array<char,_64UL> datetimeBuffer;
  time_t timeTNow;
  char local_231;
  char *local_230;
  long local_228;
  char local_220;
  undefined7 uStack_21f;
  string local_210 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0 [2];
  size_type local_1c0 [2];
  long local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_228 = 0;
  local_220 = '\0';
  local_230 = &local_220;
  switch(m_timestampMode) {
  case 1:
    tVar4.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_210[0]._M_dataplus._M_p = (pointer)&local_210[0].field_2;
    pcVar7 = "%a %b %e %H:%M:%S %Y";
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"%a %b %e %H:%M:%S %Y","");
    currentDateTime(local_1a8,(Impl *)pcVar7,tVar4,local_210);
    goto LAB_00105b11;
  case 2:
    lVar2 = std::chrono::_V2::system_clock::now();
    uVar6 = lVar2 / 1000000000;
    __val = -uVar6;
    if (0 < (long)uVar6) {
      __val = uVar6;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = __val;
      uVar1 = 4;
      do {
        __len = uVar1;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00105f91;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00105f91;
        }
        if (uVar6 < 10000) goto LAB_00105f91;
        bVar9 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar1 = __len + 4;
      } while (bVar9);
      __len = __len + 1;
    }
LAB_00105f91:
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1a8,(lVar2 < -999999999) + (char)__len);
    bVar10 = SBORROW8(lVar2,-999999999);
    bVar9 = lVar2 + 999999999 < 0;
    break;
  case 3:
    lVar2 = std::chrono::_V2::system_clock::now();
    uVar6 = lVar2 / 1000000;
    __val = -uVar6;
    if (0 < (long)uVar6) {
      __val = uVar6;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = __val;
      uVar1 = 4;
      do {
        __len = uVar1;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00105f1b;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00105f1b;
        }
        if (uVar6 < 10000) goto LAB_00105f1b;
        bVar9 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar1 = __len + 4;
      } while (bVar9);
      __len = __len + 1;
    }
LAB_00105f1b:
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1a8,(lVar2 < -999999) + (char)__len);
    bVar10 = SBORROW8(lVar2,-999999);
    bVar9 = lVar2 + 999999 < 0;
    break;
  case 4:
    lVar2 = std::chrono::_V2::system_clock::now();
    uVar6 = lVar2 / 1000;
    __val = -uVar6;
    if (0 < (long)uVar6) {
      __val = uVar6;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = __val;
      uVar1 = 4;
      do {
        __len = uVar1;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00105f56;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00105f56;
        }
        if (uVar6 < 10000) goto LAB_00105f56;
        bVar9 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar1 = __len + 4;
      } while (bVar9);
      __len = __len + 1;
    }
LAB_00105f56:
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_1a8,(lVar2 < -999) + (char)__len);
    bVar10 = SBORROW8(lVar2,-999);
    bVar9 = lVar2 + 999 < 0;
    break;
  case 5:
    tVar4.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_210[0]._M_dataplus._M_p = (pointer)&local_210[0].field_2;
    pcVar7 = "%Y-%m-%dT%H:%M:%S";
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"%Y-%m-%dT%H:%M:%S","");
    currentDateTime(local_1a8,(Impl *)pcVar7,tVar4,local_210);
LAB_00105b11:
    std::__cxx11::string::operator=((string *)&local_230,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_1a8[0].field_2._M_allocated_capacity = local_210[0].field_2._M_allocated_capacity;
    local_1d0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_210[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210[0]._M_dataplus._M_p != &local_210[0].field_2) {
LAB_00105efd:
      operator_delete(local_1d0[0],local_1a8[0].field_2._0_8_ + 1);
    }
    goto LAB_00106009;
  case 6:
    local_1b0 = std::chrono::_V2::system_clock::now();
    local_1b0 = local_1b0 / 1000000000;
    __tp = localtime(&local_1b0);
    strftime((char *)local_210,0x40,"%Y-%m-%dT%H:%M:%S",__tp);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    sVar3 = strlen((char *)local_210);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)local_210,sVar3)
    ;
    local_231 = '.';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_231,1);
    lVar2 = *(long *)poVar5;
    poVar8 = poVar5 + *(long *)(lVar2 + -0x18);
    if (poVar5[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar8);
      poVar8[0xe1] = (ostream)0x1;
      lVar2 = *(long *)poVar5;
    }
    poVar8[0xe0] = (ostream)0x30;
    *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 3;
    std::ostream::_M_insert<long>((long)poVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::operator=((string *)&local_230,(string *)local_1d0);
    local_1a8[0].field_2._0_8_ = local_1c0[0];
    if (local_1d0[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0) goto LAB_00106009;
    goto LAB_00105efd;
  case 7:
    tVar4.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    currentDateTime(local_1a8,in_RSI,tVar4,(string *)&m_customTimestampFormat_abi_cxx11_);
    std::__cxx11::string::operator=((string *)&local_230,(string *)local_1a8);
    local_1d0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1a8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) goto LAB_00105efd;
    goto LAB_00106009;
  default:
    goto switchD_00105a91_default;
  }
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_1a8[0]._M_dataplus._M_p + (bVar10 != bVar9),__len,__val);
  std::__cxx11::string::operator=((string *)&local_230,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
LAB_00106009:
  if (local_228 != 0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->m_message,local_230,local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,m_timestampSeparator_abi_cxx11_,DAT_0010b310);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
  }
switchD_00105a91_default:
  return;
}

Assistant:

void SimpleLogger::Impl::setTimestampMode(TimestampMode timestampMode)
{
    m_timestampMode = timestampMode;
}